

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
              _Bool *password_changed,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  char *__s1;
  char *first;
  char cVar8;
  bool bVar9;
  char *tok_buf;
  char netrcbuffer [4096];
  int local_109c;
  int local_1084;
  char *local_1080;
  char *local_1040;
  char local_1038 [4104];
  
  __s1 = *loginp;
  if (__s1 == (char *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = *__s1 != '\0';
  }
  local_1080 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    local_109c = 1;
  }
  else {
    local_109c = 1;
    bVar5 = false;
    local_1084 = 0;
    bVar1 = false;
    bVar2 = false;
    cVar8 = '\0';
    bVar4 = false;
    bVar3 = false;
LAB_001228e7:
    do {
      pcVar7 = fgets(local_1038,0x1000,__stream);
      if (pcVar7 == (char *)0x0) break;
      pcVar7 = strtok_r(local_1038," \t\n",&local_1040);
      if (pcVar7 != (char *)0x0) {
        if (*pcVar7 == '#') goto LAB_001228e7;
        do {
          if (((__s1 != (char *)0x0) && (local_1080 != (char *)0x0 && *__s1 != '\0')) &&
             (*local_1080 != '\0')) {
            bVar5 = true;
            break;
          }
          if (cVar8 == '\x02') {
            if (bVar2) {
              if (bVar9) {
                local_1084 = Curl_strcasecompare(__s1,pcVar7);
              }
              else if ((__s1 == (char *)0x0) || (iVar6 = strcmp(__s1,pcVar7), iVar6 != 0)) {
                if (bVar3) {
                  (*Curl_cfree)(__s1);
                  bVar3 = false;
                }
                __s1 = (*Curl_cstrdup)(pcVar7);
                if (__s1 != (char *)0x0) {
                  bVar2 = false;
                  cVar8 = '\x02';
                  bVar3 = true;
                  goto LAB_00122b61;
                }
                local_109c = -1;
                __s1 = (char *)0x0;
                goto LAB_00122ba9;
              }
              cVar8 = '\x02';
              bVar2 = false;
            }
            else {
              if (bVar1) {
                cVar8 = '\x02';
                if (((bool)(bVar9 & local_1084 == 0)) ||
                   ((local_1080 != (char *)0x0 && (iVar6 = strcmp(local_1080,pcVar7), iVar6 == 0))))
                {
                  bVar2 = false;
                }
                else {
                  if (bVar4) {
                    (*Curl_cfree)(local_1080);
                    bVar4 = false;
                  }
                  local_1080 = (*Curl_cstrdup)(pcVar7);
                  if (local_1080 == (char *)0x0) {
                    local_109c = -1;
                    local_1080 = (char *)0x0;
                    goto LAB_00122ba9;
                  }
                  bVar2 = false;
                  bVar4 = true;
                }
              }
              else {
                iVar6 = Curl_strcasecompare("login",pcVar7);
                cVar8 = '\x02';
                if (iVar6 == 0) {
                  iVar6 = Curl_strcasecompare("password",pcVar7);
                  if (iVar6 != 0) {
                    bVar2 = false;
                    bVar1 = true;
                    goto LAB_00122b61;
                  }
                  iVar6 = Curl_strcasecompare("machine",pcVar7);
                  bVar2 = false;
                  if (iVar6 != 0) {
                    local_1084 = 0;
                  }
                  cVar8 = (iVar6 == 0) + '\x01';
                }
                else {
                  bVar2 = true;
                }
              }
              bVar1 = false;
            }
          }
          else {
            first = host;
            if (cVar8 != '\x01') {
              iVar6 = Curl_strcasecompare("machine",pcVar7);
              cVar8 = '\x01';
              if (iVar6 != 0) goto LAB_00122b61;
              first = "default";
            }
            iVar6 = Curl_strcasecompare(first,pcVar7);
            if (iVar6 != 0) {
              local_109c = 0;
            }
            cVar8 = (iVar6 != 0) * '\x02';
          }
LAB_00122b61:
          pcVar7 = strtok_r((char *)0x0," \t\n",&local_1040);
        } while (pcVar7 != (char *)0x0);
      }
    } while (!bVar5);
LAB_00122ba9:
    if (local_109c == 0) {
      *login_changed = false;
      *password_changed = false;
      if (bVar3) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = __s1;
        *login_changed = true;
      }
      if (bVar4) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = local_1080;
        *password_changed = true;
      }
    }
    else {
      if (bVar3) {
        (*Curl_cfree)(__s1);
      }
      if (bVar4) {
        (*Curl_cfree)(local_1080);
      }
    }
    fclose(__stream);
  }
  return local_109c;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      bool *login_changed,
                      bool *password_changed,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else if(!login || strcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
                && (!password || strcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      /* success */
      *login_changed = FALSE;
      *password_changed = FALSE;
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
        *login_changed = TRUE;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
        *password_changed = TRUE;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}